

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void temperature_monitor(void)

{
  float fVar1;
  int local_18;
  pal_result local_14;
  int i;
  pal_result result;
  float t_c;
  unsigned_short t;
  
  i = 0;
  local_14 = PAL_ERROR_ARG;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    local_14 = pal_temperature_get((unsigned_short *)((long)&result + 2));
    if (local_14 == PAL_OK) {
      fVar1 = pal_temperature_to_celsius(result._2_2_);
      i = (int)(fVar1 + (float)i);
    }
    else if (local_14 == PAL_ERROR_ARG) {
      pal_halt();
    }
    if (local_18 + 1 < 3) {
      pal_sleep(1000);
    }
  }
  fVar1 = (float)i / 3.0;
  if (local_14 == PAL_OK) {
    if (fVar1 <= 120.0) {
      if ((80.0 < fVar1) || (fVar1 < -38.0)) {
        pal_led_set_color(PAL_LED_RED);
      }
      else if ((60.0 < fVar1) || (fVar1 < -10.0)) {
        pal_led_set_color(PAL_LED_YELLOW);
      }
      else {
        pal_led_set_color(PAL_LED_GREEN);
      }
      pal_fan_set_speed((int)(fVar1 * 10.0));
    }
    else {
      pal_led_set_color(PAL_LED_RED);
      pal_fan_set_speed(0);
      pal_halt();
    }
  }
  else {
    pal_led_set_color(PAL_LED_RED);
    pal_halt();
  }
  return;
}

Assistant:

void temperature_monitor(void) {
    unsigned short t;
    float t_c = 0.0;
    pal_result result = PAL_ERROR_ARG;
    for (int i = 0; i < NUMBER_SAMPLES; i++)
    {
        result = pal_temperature_get(&t);
        if (result == PAL_OK) {
            t_c += pal_temperature_to_celsius(t);
        }
        else if (result == PAL_ERROR_ARG) {
            pal_halt();
        }

        if ((i + 1) < NUMBER_SAMPLES)
            pal_sleep(SAMPLE_INTERVAL);
    }

    t_c /= (float)NUMBER_SAMPLES;

    if (result == PAL_OK)
    {
        if (t_c > 120.0) {
            pal_led_set_color(PAL_LED_RED);
            pal_fan_set_speed((int)(0.0f));
            pal_halt();
            t_c = 0;
        }
        else {
            if ((t_c > 80.0) || (t_c < -38.0)) {
                pal_led_set_color(PAL_LED_RED);
            }
            else if ((t_c > 60.0) || (t_c < -10.0)) {
                pal_led_set_color(PAL_LED_YELLOW);
            }
            else {
                pal_led_set_color(PAL_LED_GREEN);
            }
            pal_fan_set_speed((int)(t_c * 10.0f));
        }
    }
    else {
        pal_led_set_color(PAL_LED_RED);
        pal_halt();
    }
}